

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>::Construct
                   (DB *db,LIST *params)

{
  unique_ptr<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
  uVar1;
  IfcObjectPlacement *this;
  type pIVar2;
  pointer pIVar3;
  Object *local_68;
  size_t num_args;
  unique_ptr<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
  local_20;
  unique_ptr<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
  impl;
  LIST *params_local;
  DB *db_local;
  
  impl._M_t.
  super___uniq_ptr_impl<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::IFC::Schema_2x3::IfcObjectPlacement_*,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
  .super__Head_base<0UL,_Assimp::IFC::Schema_2x3::IfcObjectPlacement_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>,_true,_true>
        )(__uniq_ptr_data<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>,_true,_true>
          )params;
  this = (IfcObjectPlacement *)operator_new(0x28);
  Assimp::IFC::Schema_2x3::IfcObjectPlacement::IfcObjectPlacement(this);
  std::
  unique_ptr<Assimp::IFC::Schema_2x3::IfcObjectPlacement,std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>>
  ::unique_ptr<std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>,void>
            ((unique_ptr<Assimp::IFC::Schema_2x3::IfcObjectPlacement,std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>>
              *)&local_20,this);
  uVar1 = impl;
  pIVar2 = std::
           unique_ptr<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
           ::operator*(&local_20);
  GenericFill<Assimp::IFC::Schema_2x3::IfcObjectPlacement>
            (db,(LIST *)uVar1._M_t.
                        super___uniq_ptr_impl<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::IFC::Schema_2x3::IfcObjectPlacement_*,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
                        .super__Head_base<0UL,_Assimp::IFC::Schema_2x3::IfcObjectPlacement_*,_false>
                        ._M_head_impl,pIVar2);
  pIVar3 = std::
           unique_ptr<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
           ::release(&local_20);
  local_68 = (Object *)0x0;
  if (pIVar3 != (pointer)0x0) {
    local_68 = (Object *)
               ((long)&(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>
                       )._vptr_ObjectHelper +
               (long)(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
                     _vptr_ObjectHelper[-3]);
  }
  std::
  unique_ptr<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_std::default_delete<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
  ::~unique_ptr(&local_20);
  return local_68;
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }